

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4afdb9::Db::parseBracedExpr(Db *this)

{
  char cVar1;
  char *pcVar2;
  Node *pNVar3;
  BracedExpr *pBVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  NameState *in_RSI;
  bool local_31;
  Node *Init;
  Node *Field;
  
  pcVar2 = this->First;
  if (((this->Last != pcVar2) && (1 < (ulong)((long)this->Last - (long)pcVar2))) && (*pcVar2 == 'd')
     ) {
    cVar1 = pcVar2[1];
    if (cVar1 == 'X') {
      this->First = pcVar2 + 2;
      pNVar3 = parseExpr(this);
      if (((pNVar3 != (Node *)0x0) && (pNVar5 = parseExpr(this), pNVar5 != (Node *)0x0)) &&
         (pNVar6 = parseBracedExpr(this), pNVar6 != (Node *)0x0)) {
        pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar7->K = KBracedRangeExpr;
        pNVar7->RHSComponentCache = No;
        pNVar7->ArrayCache = No;
        pNVar7->FunctionCache = No;
        pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206fd0;
        pNVar7[1]._vptr_Node = (_func_int **)pNVar3;
        *(Node **)&pNVar7[1].K = pNVar5;
        pNVar7[2]._vptr_Node = (_func_int **)pNVar6;
        return pNVar7;
      }
    }
    else if (cVar1 == 'x') {
      this->First = pcVar2 + 2;
      Field = parseExpr(this);
      if ((Field != (Node *)0x0) && (Init = parseBracedExpr(this), Init != (Node *)0x0)) {
        local_31 = true;
LAB_0019c5d3:
        pBVar4 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::BracedExpr,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&,bool>
                           ((Db *)this,&Field,&Init,&local_31);
        return (Node *)pBVar4;
      }
    }
    else {
      if (cVar1 != 'i') goto LAB_0019c585;
      this->First = pcVar2 + 2;
      Field = parseSourceName(this,in_RSI);
      if ((Field != (Node *)0x0) && (Init = parseBracedExpr(this), Init != (Node *)0x0)) {
        local_31 = false;
        goto LAB_0019c5d3;
      }
    }
    return (Node *)0x0;
  }
LAB_0019c585:
  pNVar3 = parseExpr(this);
  return pNVar3;
}

Assistant:

Node *Db::parseBracedExpr() {
  if (look() == 'd') {
    switch (look(1)) {
    case 'i': {
      First += 2;
      Node *Field = parseSourceName(/*NameState=*/nullptr);
      if (Field == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedExpr>(Field, Init, /*isArray=*/false);
    }
    case 'x': {
      First += 2;
      Node *Index = parseExpr();
      if (Index == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedExpr>(Index, Init, /*isArray=*/true);
    }
    case 'X': {
      First += 2;
      Node *RangeBegin = parseExpr();
      if (RangeBegin == nullptr)
        return nullptr;
      Node *RangeEnd = parseExpr();
      if (RangeEnd == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedRangeExpr>(RangeBegin, RangeEnd, Init);
    }
    }
  }
  return parseExpr();
}